

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_engine.hpp
# Opt level: O2

void cppurses::detail::Event_engine::send_all_deletes(Event_queue *queue)

{
  Widget *receiver;
  bool bVar1;
  Move_iterator __end2;
  Move_iterator __begin2;
  undefined1 local_c0 [8];
  Move_iterator local_b8;
  Move_iterator local_70;
  
  Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::Move_iterator(&local_70,queue);
  local_b8.mtx_ = &queue->mtx_;
  local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.at_ = 0;
  local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8.already_sent_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8.events_ = &queue->general_events_;
  while( true ) {
    bVar1 = Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::operator!=
                      (&local_70,&local_b8);
    if (!bVar1) break;
    Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::operator*
              ((Move_iterator *)local_c0);
    receiver = *(Widget **)((long)local_c0 + 0x10);
    System::send_event((Event *)local_c0);
    Event_queue::remove_events_of(queue,receiver);
    if (local_c0 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_c0)[1])();
    }
    Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::operator++(&local_70);
  }
  std::
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  ::~_Rb_tree(&local_b8.already_sent_._M_t);
  std::
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  ::~_Rb_tree(&local_70.already_sent_._M_t);
  return;
}

Assistant:

static auto send_all_deletes(Event_queue& queue) -> void
    {
        auto view = Event_queue::View<Event::Delete>{queue};
        for (std::unique_ptr<Event> event : view) {
            Widget* receiver = &(event->receiver());
            System::send_event(*event);
            queue.remove_events_of(receiver);
        }
    }